

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

QMetaType __thiscall QMetaType::fromName(QMetaType *this,QByteArrayView typeName)

{
  int iVar1;
  Type *pTVar2;
  int iVar3;
  char *pcVar4;
  anon_struct_16_3_a0b52c67 *paVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QReadLocker locker;
  QMetaType local_60;
  QByteArray local_58;
  Type *local_38;
  long local_30;
  
  pcVar6 = (char *)typeName.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)this;
  if (iVar3 == 0) {
    iVar1 = 0;
  }
  else {
    pcVar4 = "bool";
    paVar5 = types;
    do {
      if ((paVar5->typeNameLength == iVar3) && (iVar1 = bcmp(pcVar6,pcVar4,(long)iVar3), iVar1 == 0)
         ) break;
      pcVar4 = paVar5[1].typeName;
      paVar5 = paVar5 + 1;
    } while (pcVar4 != (char *)0x0);
    iVar1 = paVar5->type;
    if (iVar1 == 0) {
      local_38 = (Type *)&DAT_aaaaaaaaaaaaaaaa;
      if ((char)QtGlobalStatic::
                Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
                guard._q_value.super___atomic_base<signed_char>._M_i < -1) {
        local_38 = (Type *)0x0;
      }
      else {
        pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                 ::instance();
        local_38 = pTVar2;
        if (((ulong)pTVar2 & 1) == 0) {
          QReadWriteLock::lockForRead(&pTVar2->lock);
          local_38 = (Type *)((ulong)pTVar2 | 1);
        }
      }
      pTVar2 = local_38;
      iVar1 = qMetaTypeCustomType_unlocked(pcVar6,iVar3);
      if (iVar1 == 0) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::normalizedType(&local_58,pcVar6);
        pcVar6 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar6 = &QByteArray::_empty;
        }
        iVar3 = (int)local_58.d.size;
        pcVar4 = "bool";
        paVar5 = types;
        do {
          if ((paVar5->typeNameLength == iVar3) &&
             (iVar1 = bcmp(pcVar6,pcVar4,(long)iVar3), iVar1 == 0)) break;
          pcVar4 = paVar5[1].typeName;
          paVar5 = paVar5 + 1;
        } while (pcVar4 != (char *)0x0);
        iVar1 = paVar5->type;
        if (iVar1 == 0) {
          iVar1 = qMetaTypeCustomType_unlocked(pcVar6,iVar3);
        }
        pTVar2 = local_38;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
            pTVar2 = local_38;
          }
        }
      }
      if (((ulong)pTVar2 & 1) != 0) {
        local_38 = (Type *)((ulong)pTVar2 & 0xfffffffffffffffe);
        QReadWriteLock::unlock((QReadWriteLock *)local_38);
      }
    }
  }
  QMetaType(&local_60,iVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QMetaType)local_60.d_ptr;
}

Assistant:

QMetaType QMetaType::fromName(QByteArrayView typeName)
{
    return QMetaType(qMetaTypeTypeImpl<TryNormalizeType>(typeName.data(), typeName.size()));
}